

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

void __thiscall ON_3dmView::Default(ON_3dmView *this)

{
  ON_3dmConstructionPlane *this_00;
  undefined8 uVar1;
  view_projection vVar2;
  long lVar3;
  ON_Plane *pOVar4;
  ON_3dmConstructionPlane *pOVar5;
  byte bVar6;
  ON_3dVector OStack_58;
  ON_3dVector local_40;
  
  bVar6 = 0;
  ON_wString::Destroy(&this->m_name);
  ON_Object::operator=((ON_Object *)this,(ON_Object *)&ON_Viewport::DefaultTopViewYUp);
  memcpy(&(this->m_vp).m_bValidCamera,&ON_Viewport::DefaultTopViewYUp.m_bValidCamera,0x220);
  uVar1 = ON_Viewport::DefaultTopViewYUp.m_projection_content_sha1.m_digest._8_8_;
  *(undefined8 *)(this->m_vp).m_projection_content_sha1.m_digest =
       ON_Viewport::DefaultTopViewYUp.m_projection_content_sha1.m_digest._0_8_;
  *(undefined8 *)((this->m_vp).m_projection_content_sha1.m_digest + 8) = uVar1;
  *(undefined4 *)((this->m_vp).m_projection_content_sha1.m_digest + 0x10) =
       ON_Viewport::DefaultTopViewYUp.m_projection_content_sha1.m_digest._16_4_;
  this_00 = &this->m_cplane;
  ON_wString::Destroy(&(this->m_cplane).m_name);
  pOVar4 = &ON_xy_plane;
  pOVar5 = this_00;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pOVar5->m_plane).origin.x = (pOVar4->origin).x;
    pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pOVar5 = (ON_3dmConstructionPlane *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->m_cplane).m_grid_spacing = 1.0;
  (this->m_cplane).m_snap_spacing = 1.0;
  (this->m_cplane).m_grid_line_count = 0x46;
  (this->m_cplane).m_grid_thick_frequency = 5;
  (this->m_cplane).m_bDepthBuffer = true;
  (this->m_display_mode_id).Data1 = 0;
  (this->m_display_mode_id).Data2 = 0;
  (this->m_display_mode_id).Data3 = 0;
  (this->m_display_mode_id).Data4[0] = '\0';
  (this->m_display_mode_id).Data4[1] = '\0';
  (this->m_display_mode_id).Data4[2] = '\0';
  (this->m_display_mode_id).Data4[3] = '\0';
  (this->m_display_mode_id).Data4[4] = '\0';
  (this->m_display_mode_id).Data4[5] = '\0';
  (this->m_display_mode_id).Data4[6] = '\0';
  (this->m_display_mode_id).Data4[7] = '\0';
  this->m_view_type = model_view_type;
  (this->m_position).m_wnd_left = 0.0;
  (this->m_position).m_wnd_right = 1.0;
  (this->m_position).m_wnd_top = 0.0;
  (this->m_position).m_wnd_bottom = 1.0;
  (this->m_position).m_bMaximized = false;
  (this->m_position).m_floating_viewport = '\0';
  (this->m_position).m_reserved_1 = '\0';
  (this->m_position).m_reserved_2 = '\0';
  (this->m_position).m_reserved_3 = '\0';
  vVar2 = ON_Viewport::Projection(&this->m_vp);
  if (vVar2 == parallel_view) {
    ON_Viewport::CameraX(&this->m_vp);
    ON_Viewport::CameraY(&this->m_vp);
    ON_Plane::CreateFromFrame(&this_00->m_plane,(ON_3dPoint *)this_00,&local_40,&OStack_58);
  }
  this->m_bShowConstructionGrid = true;
  this->m_bShowConstructionAxes = true;
  this->m_bShowConstructionZAxis = false;
  this->m_bShowWorldAxes = true;
  ON_3dmViewTraceImage::Default(&this->m_trace_image);
  ON_3dmWallpaperImage::Default(&this->m_wallpaper_image);
  (this->m_page_settings).m_page_number = 0;
  (this->m_page_settings).m_width_mm = 0.0;
  (this->m_page_settings).m_height_mm = 0.0;
  (this->m_page_settings).m_left_margin_mm = 0.0;
  (this->m_page_settings).m_right_margin_mm = 0.0;
  (this->m_page_settings).m_top_margin_mm = 0.0;
  (this->m_page_settings).m_bottom_margin_mm = 0.0;
  ON_wString::Destroy(&(this->m_page_settings).m_printer_name);
  (this->m_named_view_id).Data1 = 0;
  (this->m_named_view_id).Data2 = 0;
  (this->m_named_view_id).Data3 = 0;
  (this->m_named_view_id).Data4[0] = '\0';
  (this->m_named_view_id).Data4[1] = '\0';
  (this->m_named_view_id).Data4[2] = '\0';
  (this->m_named_view_id).Data4[3] = '\0';
  (this->m_named_view_id).Data4[4] = '\0';
  (this->m_named_view_id).Data4[5] = '\0';
  (this->m_named_view_id).Data4[6] = '\0';
  (this->m_named_view_id).Data4[7] = '\0';
  this->m_bLockedProjection = false;
  this->m_dFocalBlurDistance = 100.0;
  this->m_dFocalBlurAperture = 64.0;
  this->m_dFocalBlurJitter = 0.1;
  this->m_uFocalBlurSampleCount = 10;
  this->m_FocalBlurMode = None;
  (this->m_sizeRendering).cx = 0x280;
  (this->m_sizeRendering).cy = 0x1e0;
  return;
}

Assistant:

void ON_3dmView::Default()
{
  m_name.Destroy();

  m_vp = ON_Viewport::DefaultTopViewYUp;

  m_cplane.Default();
  m_display_mode_id = ON_nil_uuid;
  m_view_type = ON::model_view_type;
  m_position.Default();
  if ( m_vp.Projection() == ON::parallel_view ) {
    m_cplane.m_plane.CreateFromFrame( m_cplane.m_plane.origin, m_vp.CameraX(), m_vp.CameraY() );
  }
  m_bShowConstructionGrid = true;
  m_bShowConstructionAxes = true;
  m_bShowWorldAxes = true;
  m_bShowConstructionZAxis = false;

  m_trace_image.Default();
  m_wallpaper_image.Default();

  m_page_settings.Default();

  m_named_view_id = ON_nil_uuid;

  m_bLockedProjection = false;

  m_dFocalBlurDistance = 100.0;
  m_dFocalBlurAperture = 64.0;
  m_dFocalBlurJitter = 0.1;
  m_uFocalBlurSampleCount = 10;
  m_FocalBlurMode = ON_FocalBlurModes::None;
  m_sizeRendering.cx = 640;
  m_sizeRendering.cy = 480;
}